

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_time.c
# Opt level: O2

int amqp_time_ms_until(amqp_time_t time)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint64_t uVar3;
  
  if (time.time_point_ns != 0xffffffffffffffff) {
    if (time.time_point_ns == 0) {
      iVar2 = 0;
    }
    else {
      uVar3 = amqp_get_monotonic_timestamp();
      if (uVar3 == 0) {
        iVar2 = -0xe;
      }
      else {
        iVar2 = 0;
        if (uVar3 <= time.time_point_ns && time.time_point_ns - uVar3 != 0) {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = time.time_point_ns - uVar3;
          iVar2 = SUB164(auVar1 / ZEXT816(1000000),0);
        }
      }
    }
    return iVar2;
  }
  return -1;
}

Assistant:

int amqp_time_ms_until(amqp_time_t time) {
  uint64_t now_ns;
  uint64_t delta_ns;
  int left_ms;

  if (UINT64_MAX == time.time_point_ns) {
    return -1;
  }
  if (0 == time.time_point_ns) {
    return 0;
  }

  now_ns = amqp_get_monotonic_timestamp();
  if (0 == now_ns) {
    return AMQP_STATUS_TIMER_FAILURE;
  }

  if (now_ns >= time.time_point_ns) {
    return 0;
  }

  delta_ns = time.time_point_ns - now_ns;
  left_ms = (int)(delta_ns / AMQP_NS_PER_MS);

  return left_ms;
}